

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

_Bool mi_option_is_enabled(mi_option_t option)

{
  if (mi_option_generic_collect < option) {
    return false;
  }
  if (options[option].init == UNINIT) {
    mi_option_init(options + option);
  }
  return options[option].value != 0;
}

Assistant:

mi_decl_nodiscard bool mi_option_is_enabled(mi_option_t option) {
  return (mi_option_get(option) != 0);
}